

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O3

void __thiscall
TI::TMS::CharacterSequencer<(TI::TMS::Personality)3>::fetch<157>
          (CharacterSequencer<(TI::TMS::Personality)3> *this)

{
  ushort uVar1;
  Base<(TI::TMS::Personality)3> *pBVar2;
  uint uVar3;
  
  pBVar2 = (this->sprite_fetcher).base;
  uVar1 = pBVar2->sprite_attribute_table_address_;
  uVar3 = pBVar2->fetch_sprite_buffer_->active_sprites[0].index << 2;
  pBVar2->fetch_sprite_buffer_->active_sprites[0].x =
       (uint)(pBVar2->ram_)._M_elems[(uVar3 | 0xffffff81) & (uint)uVar1];
  SpriteFetcher<(TI::TMS::Personality)3,_(TI::TMS::SpriteMode)0>::fetch_image
            (&this->sprite_fetcher,0,
             (pBVar2->sprites_16x16_ - 1U | 0xfc) &
             (pBVar2->ram_)._M_elems[(uVar3 | 0xffffff82) & (uint)uVar1]);
  pBVar2 = (this->sprite_fetcher).base;
  uVar1 = pBVar2->sprite_attribute_table_address_;
  uVar3 = pBVar2->fetch_sprite_buffer_->active_sprites[1].index << 2;
  pBVar2->fetch_sprite_buffer_->active_sprites[1].x =
       (uint)(pBVar2->ram_)._M_elems[(uVar3 | 0xffffff81) & (uint)uVar1];
  SpriteFetcher<(TI::TMS::Personality)3,_(TI::TMS::SpriteMode)0>::fetch_image
            (&this->sprite_fetcher,1,
             (pBVar2->sprites_16x16_ - 1U | 0xfc) &
             (pBVar2->ram_)._M_elems[(uVar3 | 0xffffff82) & (uint)uVar1]);
  pBVar2 = (this->sprite_fetcher).base;
  pBVar2->fetch_sprite_buffer_->active_sprites[2].x =
       (uint)(pBVar2->ram_)._M_elems
             [(pBVar2->fetch_sprite_buffer_->active_sprites[2].index << 2 | 0xff81U) &
              (uint)pBVar2->sprite_attribute_table_address_];
  return;
}

Assistant:

void fetch() {
		if(cycle < 5) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 5) {
			// Fetch: n1, c2, pat2a, pat2b, y3, x3, n3, c3, pat3a, pat3b.
			sprite_fetcher.fetch_pattern(2);
			sprite_fetcher.fetch_location(3);
			sprite_fetcher.fetch_pattern(3);
		}

		if(cycle > 14 && cycle < 19) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		// Fetch 8 new sprite Y coordinates, to begin selecting sprites for next line.
		if(cycle == 19) {
			sprite_fetcher.fetch_y(0);	sprite_fetcher.fetch_y(1);	sprite_fetcher.fetch_y(2);	sprite_fetcher.fetch_y(3);
			sprite_fetcher.fetch_y(4);	sprite_fetcher.fetch_y(5);	sprite_fetcher.fetch_y(6);	sprite_fetcher.fetch_y(7);
		}

		// Body of line: tiles themselves, plus some additional potential sprites.
		if(cycle >= 27 && cycle < 155) {
			constexpr int offset = cycle - 27;
			constexpr int block = offset >> 2;
			constexpr int sub_block = offset & 3;
			switch(sub_block) {
				case 0:	character_fetcher.fetch_name(block);	break;
				case 1:
					if(!(block & 3)) {
						character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
					} else {
						constexpr int sprite = 8 + ((block >> 2) * 3) + ((block & 3) - 1);
						sprite_fetcher.fetch_y(sprite);
					}
				break;
				case 2:
					character_fetcher.fetch_pattern(block);
					character_fetcher.fetch_colour(block);
				break;
				default: break;
			}
		}

		if(cycle >= 155 && cycle < 157) {
			character_fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 157) {
			// Fetch: y0, x0, n0, c0, pat0a, pat0b, y1, x1, n1, c1, pat1a, pat1b, y2, x2.
			sprite_fetcher.fetch_location(0);
			sprite_fetcher.fetch_pattern(0);
			sprite_fetcher.fetch_location(1);
			sprite_fetcher.fetch_pattern(1);
			sprite_fetcher.fetch_location(2);
		}
	}